

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void nni_sp_ipc_register(void)

{
  nni_sp_tran_register(&ipc_tran);
  nni_sp_tran_register(&ipc_tran_unix);
  nni_sp_tran_register(&ipc_tran_abstract);
  return;
}

Assistant:

void
nni_sp_ipc_register(void)
{
	nni_sp_tran_register(&ipc_tran);
#ifdef NNG_PLATFORM_POSIX
	nni_sp_tran_register(&ipc_tran_unix);
#endif
#ifdef NNG_HAVE_ABSTRACT_SOCKETS
	nni_sp_tran_register(&ipc_tran_abstract);
#endif
}